

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin_ImpactGenerator.cpp
# Opt level: O0

int ImpactGenerator::SetFloatParameterCallback(UnityAudioEffectState *state,int index,float value)

{
  EffectData *pEVar1;
  ImpactInstance *pIVar2;
  ImpactInstance *instance;
  EffectData *data;
  float value_local;
  int index_local;
  UnityAudioEffectState *state_local;
  
  pEVar1 = UnityAudioEffectState::GetEffectData<ImpactGenerator::EffectData>(state);
  if (index < 4) {
    pEVar1->p[index] = value;
    if ((index == 3) &&
       (pIVar2 = GetImpactInstance((int)pEVar1->p[0]), pIVar2 != (ImpactInstance *)0x0)) {
      pIVar2->maximpacts = (int)value;
    }
    state_local._4_4_ = 0;
  }
  else {
    state_local._4_4_ = 1;
  }
  return state_local._4_4_;
}

Assistant:

UNITY_AUDIODSP_RESULT UNITY_AUDIODSP_CALLBACK SetFloatParameterCallback(UnityAudioEffectState* state, int index, float value)
    {
        EffectData* data = state->GetEffectData<EffectData>();
        if (index >= P_NUM)
            return UNITY_AUDIODSP_ERR_UNSUPPORTED;
        data->p[index] = value;
        if (index == P_MAXIMPACTS)
        {
            ImpactInstance* instance = GetImpactInstance((int)data->p[P_INSTANCE]);
            if (instance != NULL)
                instance->maximpacts = value;
        }
        return UNITY_AUDIODSP_OK;
    }